

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_816fb2::SF_Crypt::setDecodeParms(SF_Crypt *this,QPDFObjectHandle *decode_parms)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  string local_c8;
  string local_a8;
  string local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  bVar2 = QPDFObjectHandle::isNull(decode_parms);
  bVar6 = true;
  if (!bVar2) {
    QPDFObjectHandle::getKeys_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_60,decode_parms);
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
        &local_60._M_impl.super__Rb_tree_header) {
      bVar6 = true;
    }
    else {
      local_68 = &local_a8.field_2;
      bVar6 = true;
      p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        iVar4 = std::__cxx11::string::compare((char *)(p_Var5 + 1));
        if ((iVar4 == 0) ||
           (iVar4 = std::__cxx11::string::compare((char *)(p_Var5 + 1)), iVar4 == 0)) {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"/Type","");
          bVar2 = QPDFObjectHandle::hasKey(decode_parms,&local_c8);
          if (bVar2) {
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"/CryptFilterDecodeParms","");
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,anon_var_dwarf_49b1 + 4);
            bVar3 = QPDFObjectHandle::isDictionaryOfType(decode_parms,&local_a8,&local_88);
            bVar1 = true;
            bVar2 = true;
          }
          else {
            bVar1 = true;
            bVar2 = false;
            bVar3 = true;
          }
        }
        else {
          bVar1 = false;
          bVar2 = false;
          bVar3 = false;
        }
        if (bVar2) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((bVar1) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2)) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (bVar3 == false) {
          bVar6 = false;
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return bVar6;
}

Assistant:

bool
        setDecodeParms(QPDFObjectHandle decode_parms) override
        {
            if (decode_parms.isNull()) {
                return true;
            }
            bool filterable = true;
            for (auto const& key: decode_parms.getKeys()) {
                if (((key == "/Type") || (key == "/Name")) &&
                    ((!decode_parms.hasKey("/Type")) ||
                     decode_parms.isDictionaryOfType("/CryptFilterDecodeParms"))) {
                    // we handle this in decryptStream
                } else {
                    filterable = false;
                }
            }
            return filterable;
        }